

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::emit_atomic_func_op
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,uint32_t op0,uint32_t op1,
          uint32_t op2,char *op)

{
  uint32_t result_id_00;
  char (*ts_7) [2];
  uint32_t result_id_local;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  result_id_local = result_id;
  ::std::__detail::
  _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::insert((_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            *)&(this->super_Compiler).forced_temporaries,&result_id_local);
  result_id_00 = result_id_local;
  to_non_uniform_aware_expression_abi_cxx11_(&local_90,this,op0);
  to_unpacked_expression_abi_cxx11_(&local_b0,this,op1,true);
  ts_7 = (char (*) [2])0x23be02;
  to_unpacked_expression_abi_cxx11_(&local_50,this,op2,true);
  join<char_const*&,char_const(&)[2],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[2]>
            (&local_70,(spirv_cross *)&op,(char **)0x2c2359,(char (*) [2])&local_90,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2bed76,
             (char (*) [3])&local_b0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2bed76,
             (char (*) [3])&local_50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2cdc84,ts_7);
  emit_op(this,result_type,result_id_00,&local_70,false,false);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_b0);
  ::std::__cxx11::string::~string((string *)&local_90);
  Compiler::flush_all_atomic_capable_variables(&this->super_Compiler);
  return;
}

Assistant:

void CompilerGLSL::emit_atomic_func_op(uint32_t result_type, uint32_t result_id,
                                       uint32_t op0, uint32_t op1, uint32_t op2,
                                       const char *op)
{
	forced_temporaries.insert(result_id);
	emit_op(result_type, result_id,
	        join(op, "(", to_non_uniform_aware_expression(op0), ", ",
	             to_unpacked_expression(op1), ", ", to_unpacked_expression(op2), ")"), false);
	flush_all_atomic_capable_variables();
}